

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void * TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_>::ThreadWork
                 (void *voidptr)

{
  undefined1 uVar1;
  TPZFMatrix<long_double> *assembleItem;
  TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_> *in_RDI;
  TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_> data;
  TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_> *myptr;
  TPZFMatrix<long_double> *in_stack_00000260;
  TPZFMatrix<long_double> *in_stack_00000268;
  TPZDohrSubstructCondense<long_double> *in_stack_00000270;
  TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>
  *in_stack_ffffffffffffff78;
  TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>
  *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffffa0;
  TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_>
  *in_stack_ffffffffffffffb8;
  TPZAutoPointer<TPZDohrSubstructCondense<long_double>_> local_28;
  TPZAutoPointer local_20 [8];
  TPZAutoPointer<TPZDohrAssembleItem<long_double>_> local_18;
  TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_> *local_10;
  TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_> *local_8;
  
  local_10 = in_RDI;
  local_8 = in_RDI;
  PopItem(in_stack_ffffffffffffffb8);
  while( true ) {
    uVar1 = TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>::IsValid
                      ((TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>
                        *)0x1f847e5);
    if (!(bool)uVar1) break;
    TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>::operator->(&local_28);
    assembleItem = ::TPZAutoPointer::operator_cast_to_TPZFMatrix_(local_20);
    TPZAutoPointer<TPZDohrAssembleItem<long_double>_>::operator->(&local_18);
    TPZDohrSubstructCondense<long_double>::Contribute_v2_local
              (in_stack_00000270,in_stack_00000268,in_stack_00000260);
    TPZAutoPointer<TPZDohrAssembleList<long_double>_>::operator->
              ((TPZAutoPointer<TPZDohrAssembleList<long_double>_> *)&local_10[2].fv2_local);
    TPZAutoPointer<TPZDohrAssembleItem<long_double>_>::TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleItem<long_double>_> *)in_stack_ffffffffffffff80,
               (TPZAutoPointer<TPZDohrAssembleItem<long_double>_> *)in_stack_ffffffffffffff78);
    TPZDohrAssembleList<long_double>::AddItem
              ((TPZDohrAssembleList<long_double> *)CONCAT17(uVar1,in_stack_ffffffffffffffa0),
               (TPZAutoPointer<TPZDohrAssembleItem<long_double>_> *)assembleItem);
    TPZAutoPointer<TPZDohrAssembleItem<long_double>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZDohrAssembleItem<long_double>_> *)in_stack_ffffffffffffff80);
    PopItem(in_stack_ffffffffffffffb8);
    TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>::operator=
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>::
    ~TPZDohrPrecondV2SubData(in_stack_ffffffffffffff80);
  }
  TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>::
  ~TPZDohrPrecondV2SubData(local_8);
  return local_8;
}

Assistant:

void *TPZDohrPrecondV2SubDataList<TVar,TSubStruct>::ThreadWork(void *voidptr)
{
	TPZDohrPrecondV2SubDataList<TVar,TSubStruct>	*myptr = (TPZDohrPrecondV2SubDataList<TVar,TSubStruct> *) voidptr;
	TPZDohrPrecondV2SubData<TVar,TSubStruct> data = myptr->PopItem();
	while (data.IsValid()) {
		data.fSubStructure->Contribute_v2_local(data.fInput_local,data.fv2_local->fAssembleData);
		myptr->fAssemblyStructure->AddItem(data.fv2_local);
		data = myptr->PopItem();
	}
	return voidptr;
}